

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lights.cpp
# Opt level: O0

Float __thiscall
pbrt::PortalImageInfiniteLight::PDF_Li
          (PortalImageInfiniteLight *this,LightSampleContext ctx,Vector3f w,bool allowIncompletePDF)

{
  undefined1 auVar1 [16];
  Point2f p;
  Vector3f wRender;
  bool bVar2;
  Bounds2f *b_00;
  byte in_SIL;
  LightSampleContext *in_RDI;
  Float FVar3;
  undefined8 uVar4;
  undefined1 in_ZMM0 [64];
  float fVar5;
  Point3f PVar6;
  Float pdf;
  PortalImageInfiniteLight *in_stack_00000098;
  optional<pbrt::Bounds2<float>_> b;
  Tuple3<pbrt::Point3,_float> in_stack_000000b0;
  optional<pbrt::Point2<float>_> uv;
  Float duv_dw;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar7;
  float fVar8;
  float fVar9;
  undefined4 uStack_dc;
  undefined4 in_stack_ffffffffffffff50;
  undefined4 in_stack_ffffffffffffff54;
  PortalImageInfiniteLight *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  float in_stack_ffffffffffffff78;
  optional local_7c [20];
  undefined4 local_68;
  undefined8 local_58;
  undefined8 local_48;
  optional local_3c [12];
  float local_30;
  byte local_29;
  undefined8 local_20;
  undefined8 local_10;
  float local_4;
  
  local_58 = vmovlpd_avx(in_ZMM0._0_16_);
  local_29 = in_SIL & 1;
  wRender.super_Tuple3<pbrt::Vector3,_float>.y = (float)in_stack_ffffffffffffff74;
  wRender.super_Tuple3<pbrt::Vector3,_float>.x = (float)in_stack_ffffffffffffff70;
  wRender.super_Tuple3<pbrt::Vector3,_float>.z = in_stack_ffffffffffffff78;
  local_48 = local_58;
  local_20 = local_58;
  local_10 = local_58;
  ImageFromRender(in_stack_ffffffffffffff58,wRender,
                  (Float *)CONCAT44(in_stack_ffffffffffffff54,in_stack_ffffffffffffff50));
  bVar2 = pstd::optional::operator_cast_to_bool(local_3c);
  if (bVar2) {
    uVar4 = 0;
    if ((local_30 != 0.0) || (NAN(local_30))) {
      PVar6 = LightSampleContext::p(in_RDI);
      fVar5 = PVar6.super_Tuple3<pbrt::Point3,_float>.z;
      fVar8 = PVar6.super_Tuple3<pbrt::Point3,_float>.y;
      fVar9 = (float)uVar4;
      uStack_dc = (undefined4)((ulong)uVar4 >> 0x20);
      auVar1._8_4_ = fVar9;
      auVar1._0_8_ = PVar6.super_Tuple3<pbrt::Point3,_float>._0_8_;
      auVar1._12_4_ = uStack_dc;
      vmovlpd_avx(auVar1);
      ImageBounds(in_stack_00000098,(Point3f)in_stack_000000b0);
      bVar2 = pstd::optional::operator_cast_to_bool(local_7c);
      uVar7 = CONCAT13(bVar2,(int3)in_stack_ffffffffffffff10);
      if (bVar2) {
        b_00 = (Bounds2f *)
               pstd::optional<pbrt::Point2<float>_>::operator*
                         ((optional<pbrt::Point2<float>_> *)0x6c56cb);
        pstd::optional<pbrt::Bounds2<float>_>::operator*
                  ((optional<pbrt::Bounds2<float>_> *)0x6c56ec);
        p.super_Tuple2<pbrt::Point2,_float>.y = fVar9;
        p.super_Tuple2<pbrt::Point2,_float>.x = fVar8;
        FVar3 = WindowedPiecewiseConstant2D::PDF
                          ((WindowedPiecewiseConstant2D *)CONCAT44(fVar5,uVar7),p,b_00);
        local_4 = FVar3 / local_30;
      }
      else {
        local_4 = 0.0;
      }
      local_68 = 1;
      pstd::optional<pbrt::Bounds2<float>_>::~optional((optional<pbrt::Bounds2<float>_> *)0x6c574c);
      goto LAB_006c574c;
    }
  }
  local_4 = 0.0;
  local_68 = 1;
LAB_006c574c:
  pstd::optional<pbrt::Point2<float>_>::~optional((optional<pbrt::Point2<float>_> *)0x6c5759);
  return local_4;
}

Assistant:

PBRT_CPU_GPU Float PortalImageInfiniteLight::PDF_Li(LightSampleContext ctx, Vector3f w,
                                       bool allowIncompletePDF) const {
    // Find image $(u,v)$ coordinates corresponding to direction _w_
    Float duv_dw;
    pstd::optional<Point2f> uv = ImageFromRender(w, &duv_dw);
    if (!uv || duv_dw == 0)
        return 0;

    // Return PDF for sampling $(u,v)$ from reference point
    pstd::optional<Bounds2f> b = ImageBounds(ctx.p());
    if (!b)
        return 0;
    Float pdf = distribution.PDF(*uv, *b);
    return pdf / duv_dw;
}